

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O1

optional<int>
slang::ast::bindArrayIndexSetter
          (ASTContext *context,Expression *keyExpr,Type *elementType,ExpressionSyntax *valueSyntax,
          SmallMap<int,_const_slang::ast::Expression_*,_8UL,_std::pair<const_int,_const_slang::ast::Expression_*>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
          *indexMap,
          SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>
          *indexSetters)

{
  undefined1 *this;
  char *pcVar1;
  long lVar2;
  undefined4 uVar3;
  int iVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  Expression *this_00;
  ulong uVar8;
  Diagnostic *this_01;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  pair<const_int,_const_slang::ast::Expression_*> *ppVar12;
  ulong hash;
  pair<const_int,_const_slang::ast::Expression_*> *ppVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  undefined1 auVar18 [16];
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffff68;
  optional<int> index;
  Expression *local_78;
  ulong local_70;
  ulong local_68;
  undefined1 *local_60;
  Expression *local_58;
  SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter> *local_50;
  locator res;
  
  index = ASTContext::evalInteger(context,keyExpr,(bitmask<slang::ast::EvalFlags>)0x0);
  if (index.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
      _M_engaged == true) {
    uVar8 = 0;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = context;
    this_00 = Expression::bindRValue
                        ((Expression *)elementType,(Type *)valueSyntax,(ExpressionSyntax *)0x0,
                         (SourceRange)(auVar6 << 0x40),(ASTContext *)0x0,in_stack_ffffffffffffff68);
    bVar7 = Expression::bad(this_00);
    uVar10 = 0;
    uVar9 = 0;
    if (bVar7) goto LAB_0049e010;
    this = &(indexMap->super_Storage).field_0x88;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (long)index.super__Optional_base<int,_true,_true>._M_payload.
                         super__Optional_payload_base<int>._M_payload._M_value;
    hash = SUB168(auVar5 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar5 * ZEXT816(0x9e3779b97f4a7c15),0);
    local_60 = &indexMap->field_0x90;
    uVar8 = hash >> (indexMap->field_0x90 & 0x3f);
    uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[hash & 0xff];
    local_70 = *(ulong *)&indexMap->field_0x98;
    uVar9 = 0;
    uVar10 = uVar8;
    do {
      local_68 = uVar9;
      pcVar1 = (char *)(*(long *)&indexMap->field_0xa0 + uVar10 * 0x10);
      cVar14 = (char)uVar3;
      auVar18[0] = -(*pcVar1 == cVar14);
      cVar15 = (char)((uint)uVar3 >> 8);
      auVar18[1] = -(pcVar1[1] == cVar15);
      cVar16 = (char)((uint)uVar3 >> 0x10);
      auVar18[2] = -(pcVar1[2] == cVar16);
      cVar17 = (char)((uint)uVar3 >> 0x18);
      auVar18[3] = -(pcVar1[3] == cVar17);
      auVar18[4] = -(pcVar1[4] == cVar14);
      auVar18[5] = -(pcVar1[5] == cVar15);
      auVar18[6] = -(pcVar1[6] == cVar16);
      auVar18[7] = -(pcVar1[7] == cVar17);
      auVar18[8] = -(pcVar1[8] == cVar14);
      auVar18[9] = -(pcVar1[9] == cVar15);
      auVar18[10] = -(pcVar1[10] == cVar16);
      auVar18[0xb] = -(pcVar1[0xb] == cVar17);
      auVar18[0xc] = -(pcVar1[0xc] == cVar14);
      auVar18[0xd] = -(pcVar1[0xd] == cVar15);
      auVar18[0xe] = -(pcVar1[0xe] == cVar16);
      auVar18[0xf] = -(pcVar1[0xf] == cVar17);
      uVar11 = (uint)(ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe);
      if (uVar11 != 0) {
        lVar2 = *(long *)&indexMap->field_0xa8 + uVar10 * 0xf0;
        do {
          iVar4 = 0;
          if (uVar11 != 0) {
            for (; (uVar11 >> iVar4 & 1) == 0; iVar4 = iVar4 + 1) {
            }
          }
          if (index.super__Optional_base<int,_true,_true>._M_payload.
              super__Optional_payload_base<int>._M_payload._M_value ==
              *(int *)(lVar2 + (ulong)(uint)(iVar4 << 4))) {
            ppVar12 = (pair<const_int,_const_slang::ast::Expression_*> *)
                      ((ulong)(uint)(iVar4 << 4) + lVar2);
            goto LAB_0049df5e;
          }
          uVar11 = uVar11 - 1 & uVar11;
        } while (uVar11 != 0);
      }
      if ((*(byte *)(uVar10 * 0x10 + *(long *)&indexMap->field_0xa0 + 0xf) &
          (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7]) == 0) break;
      uVar10 = uVar10 + local_68 + 1 & local_70;
      uVar9 = local_68 + 1;
    } while (local_68 + 1 <= local_70);
    ppVar12 = (pair<const_int,_const_slang::ast::Expression_*> *)0x0;
LAB_0049df5e:
    ppVar13 = ppVar12;
    local_78 = this_00;
    local_58 = this_00;
    local_50 = indexSetters;
    if (ppVar12 == (pair<const_int,_const_slang::ast::Expression_*> *)0x0) {
      if (*(ulong *)&indexMap->field_0xb8 < *(ulong *)&indexMap->field_0xb0) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<int,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<int,void>,std::equal_to<int>,slang::detail::hashing::StackAllocator<std::pair<int_const,slang::ast::Expression_const*>,128ul,16ul>>
        ::
        nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,int&,slang::ast::Expression_const*>
                  (&res,(table_core<boost::unordered::detail::foa::flat_map_types<int,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<int,void>,std::equal_to<int>,slang::detail::hashing::StackAllocator<std::pair<int_const,slang::ast::Expression_const*>,128ul,16ul>>
                         *)this,(arrays_type *)local_60,uVar8,hash,
                   (try_emplace_args_t *)&stack0xffffffffffffff6f,(int *)&index,&local_78);
        *(long *)&indexMap->field_0xb8 = *(long *)&indexMap->field_0xb8 + 1;
        ppVar13 = res.p;
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<int,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<int,void>,std::equal_to<int>,slang::detail::hashing::StackAllocator<std::pair<int_const,slang::ast::Expression_const*>,128ul,16ul>>
        ::
        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,int&,slang::ast::Expression_const*>
                  (&res,(table_core<boost::unordered::detail::foa::flat_map_types<int,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<int,void>,std::equal_to<int>,slang::detail::hashing::StackAllocator<std::pair<int_const,slang::ast::Expression_const*>,128ul,16ul>>
                         *)this,hash,(try_emplace_args_t *)&stack0xffffffffffffff6f,(int *)&index,
                   &local_78);
        ppVar13 = res.p;
      }
    }
    if (ppVar12 == (pair<const_int,_const_slang::ast::Expression_*> *)0x0) {
      res._8_8_ = local_58;
      res.pg = (group15<boost::unordered::detail::foa::plain_integral> *)keyExpr;
      SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>::
      emplace_back<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>
                (local_50,(IndexSetter *)&res);
      uVar9 = (ulong)index.super__Optional_base<int,_true,_true>._M_payload.
                     super__Optional_payload_base<int> & 0xffffff0000000000;
      uVar8 = (ulong)index.super__Optional_base<int,_true,_true>._M_payload.
                     super__Optional_payload_base<int> & 0xff00000000;
      uVar10 = (ulong)index.super__Optional_base<int,_true,_true>._M_payload.
                      super__Optional_payload_base<int> & 0xffffffff;
      goto LAB_0049e010;
    }
    this_01 = ASTContext::addDiag(context,(DiagCode)0x110007,keyExpr->sourceRange);
    res.pg = (group15<boost::unordered::detail::foa::plain_integral> *)
             (long)index.super__Optional_base<int,_true,_true>._M_payload.
                   super__Optional_payload_base<int>._M_payload._M_value;
    std::
    vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
    ::emplace_back<long>(&this_01->args,(long *)&res);
    Diagnostic::addNote(this_01,(DiagCode)0xa0001,ppVar13->second->sourceRange);
  }
  uVar8 = 0;
  uVar10 = 0;
  uVar9 = 0;
LAB_0049e010:
  return (_Optional_base<int,_true,_true>)(_Optional_base<int,_true,_true>)(uVar8 | uVar10 | uVar9);
}

Assistant:

static std::optional<int32_t> bindArrayIndexSetter(
    const ASTContext& context, const Expression& keyExpr, const Type& elementType,
    const ExpressionSyntax& valueSyntax, SmallMap<int32_t, const Expression*, 8>& indexMap,
    SmallVectorBase<StructuredAssignmentPatternExpression::IndexSetter>& indexSetters) {

    std::optional<int32_t> index = context.evalInteger(keyExpr);
    if (!index)
        return std::nullopt;

    auto& expr = Expression::bindRValue(elementType, valueSyntax, {}, context);
    if (expr.bad())
        return std::nullopt;

    auto [it, inserted] = indexMap.emplace(*index, &expr);
    if (!inserted) {
        auto& diag = context.addDiag(diag::AssignmentPatternKeyDupValue, keyExpr.sourceRange);
        diag << *index;
        diag.addNote(diag::NotePreviousDefinition, it->second->sourceRange);
        return std::nullopt;
    }

    indexSetters.push_back({&keyExpr, &expr});
    return index;
}